

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::CampaignManager::CampaignManager(CampaignManager *this,Comm *comm)

{
  int iVar1;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  allocator local_1d [29];
  
  UserOptions::Campaign::Campaign
            ((Campaign *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  *(undefined1 *)(in_RDI + 0x68) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x70));
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>_>
                   *)0xdb4862);
  std::ofstream::ofstream((void *)(in_RDI + 0xd0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x2d0),".adios-campaign",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  iVar1 = helper::Comm::Rank((Comm *)0xdb48c5);
  *(int *)(in_RDI + 0x90) = iVar1;
  return;
}

Assistant:

CampaignManager::CampaignManager(adios2::helper::Comm &comm) { m_WriterRank = comm.Rank(); }